

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O2

void av1_warp_affine_sse4_1
               (int32_t *mat,uint8_t *ref,int width,int height,int stride,uint8_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,int16_t delta)

{
  uint alpha_00;
  uint alpha_01;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int j;
  int iVar9;
  int iVar10;
  __m128i *palVar11;
  int iVar12;
  int iVar13;
  int reduce_bits_vert;
  uint uVar14;
  int iVar15;
  int i;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int gamma_00;
  int iVar19;
  int iVar20;
  uint uVar21;
  int offset_bits;
  uint uVar22;
  undefined4 uVar23;
  undefined1 auVar24 [16];
  __m128i src;
  __m128i src_00;
  __m128i src_01;
  __m128i src_02;
  __m128i src_03;
  int in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffce0;
  __m128i wt;
  __m128i round_bits_const;
  __m128i res_sub_const;
  int local_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  uint8_t *local_208;
  undefined8 uStack_200;
  longlong local_1f8 [2];
  __m128i res_lo;
  __m128i coeffs [8];
  __m128i tmp [15];
  
  alpha_00 = conv_params->round_0;
  if (conv_params->is_compound == 0) {
    reduce_bits_vert = 0xe - alpha_00;
    iVar7 = conv_params->round_1;
  }
  else {
    iVar7 = conv_params->round_1;
    reduce_bits_vert = iVar7;
  }
  iVar12 = 1;
  offset_bits = 0x16 - alpha_00;
  iVar9 = offset_bits;
  if (conv_params->is_compound != 1) {
    iVar12 = -1;
    iVar9 = reduce_bits_vert + 7;
  }
  local_218 = ((1 << ((byte)reduce_bits_vert & 0x1f)) >> 1) + (iVar12 << ((byte)iVar9 & 0x1f));
  iVar12 = 0xe - (iVar7 + alpha_00);
  alpha_01 = (uint)alpha;
  iVar17 = (int)beta;
  gamma_00 = (int)gamma;
  iVar19 = (int)delta;
  iVar20 = 1 << (0xeU - (char)alpha_00 & 0x1f);
  bVar6 = 7 - (char)alpha_00;
  iVar7 = iVar17 * -3 + 0x10200;
  iVar9 = height + -1;
  iStack_214 = local_218;
  iStack_210 = local_218;
  iStack_20c = local_218;
  for (i = 0; iVar10 = p_height - i, iVar10 != 0 && i <= p_height; i = i + 8) {
    if (7 < iVar10) {
      iVar10 = 8;
    }
    lVar4 = (long)(p_row + 4 + i << ((byte)subsampling_y & 0x1f));
    iVar1 = iVar10 + -4;
    for (j = 0; uVar18 = (ulong)(uint)stride, j < p_width; j = j + 8) {
      lVar5 = (long)(p_col + 4 + j << ((byte)subsampling_x & 0x1f));
      lVar16 = (long)*mat + mat[3] * lVar4 + mat[2] * lVar5 >> ((byte)subsampling_x & 0x3f);
      lVar5 = (long)mat[1] + mat[5] * lVar4 + mat[4] * lVar5 >> ((byte)subsampling_y & 0x3f);
      uVar22 = (uint)((ulong)lVar16 >> 0x10);
      iVar13 = (int)((ulong)lVar5 >> 0x10);
      if ((int)uVar22 < -6) {
        palVar11 = tmp;
        for (lVar16 = -7; lVar16 < iVar10; lVar16 = lVar16 + 1) {
          iVar15 = iVar13 + (int)lVar16;
          if ((long)height <= iVar13 + lVar16) {
            iVar15 = iVar9;
          }
          if (iVar13 + lVar16 < 0) {
            iVar15 = 0;
          }
          auVar24 = ZEXT416(((uint)ref[iVar15 * stride] << (bVar6 & 0x1f)) + iVar20);
          auVar24 = pshuflw(auVar24,auVar24,0);
          uVar23 = auVar24._0_4_;
          *(undefined4 *)*palVar11 = uVar23;
          *(undefined4 *)((long)*palVar11 + 4) = uVar23;
          *(undefined4 *)(*palVar11 + 1) = uVar23;
          *(undefined4 *)((long)*palVar11 + 0xc) = uVar23;
          palVar11 = palVar11 + 1;
        }
      }
      else if ((int)uVar22 < width + 6) {
        uVar14 = ((uint)lVar16 & 0xfffc) + (iVar17 + alpha_01) * -4 & 0xffffffc0;
        if (width < (int)(uVar22 + 9) || (int)uVar22 < 7) {
          uVar21 = (uVar22 - width) + 8;
          local_208 = ref + (long)(int)uVar22 + -7;
          iVar15 = uVar14 + iVar7;
          lVar16 = lVar4;
          for (iVar3 = -7; iVar3 < iVar10; iVar3 = iVar3 + 1) {
            iVar2 = iVar13 + iVar3;
            iVar8 = iVar9;
            if (iVar2 < height) {
              iVar8 = iVar2;
            }
            if (iVar2 < 0) {
              iVar8 = 0;
            }
            auVar24 = *(undefined1 (*) [16])(local_208 + iVar8 * stride);
            if ((int)uVar22 < 7) {
              auVar24 = pshufb(auVar24,(undefined1  [16])warp_pad_left[6 - uVar22]);
            }
            if (-1 < (int)uVar21) {
              pshufb(auVar24,(undefined1  [16])warp_pad_right[uVar21]);
            }
            src[1]._0_4_ = iVar15;
            src[0] = (longlong)tmp;
            src[1]._4_4_ = 0;
            horizontal_filter(src,(__m128i *)(ulong)alpha_01,iVar3,alpha_00,(int)lVar16,
                              in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0);
            iVar15 = iVar15 + iVar17;
          }
        }
        else if (beta == 0 && alpha == 0) {
          lVar16 = lVar4;
          prepare_horizontal_filter_coeff_alpha0(uVar14 + 0x10200,coeffs);
          for (palVar11 = (__m128i *)0xfffffff9; (int)palVar11 < iVar10;
              palVar11 = (__m128i *)(ulong)((int)palVar11 + 1)) {
            src_01[1] = (longlong)coeffs;
            src_01[0] = (longlong)tmp;
            filter_src_pixels(src_01,(__m128i *)(ulong)alpha_00,palVar11,(int)uVar18,(int)lVar16,
                              in_stack_fffffffffffffcd8);
          }
        }
        else if (alpha != 0 || beta == 0) {
          if (alpha != 0 && beta == 0) {
            lVar16 = lVar4;
            prepare_horizontal_filter_coeff(alpha_01,uVar14 + 0x10200,coeffs);
            for (palVar11 = (__m128i *)0xfffffff9; (int)palVar11 < iVar10;
                palVar11 = (__m128i *)(ulong)((int)palVar11 + 1)) {
              src_02[1] = (longlong)coeffs;
              src_02[0] = (longlong)tmp;
              filter_src_pixels(src_02,(__m128i *)(ulong)alpha_00,palVar11,(int)uVar18,(int)lVar16,
                                in_stack_fffffffffffffcd8);
            }
          }
          else {
            iVar13 = uVar14 + iVar7;
            lVar16 = lVar4;
            for (iVar15 = -7; iVar15 < iVar10; iVar15 = iVar15 + 1) {
              src_03[1]._0_4_ = iVar13;
              src_03[0] = (longlong)tmp;
              src_03[1]._4_4_ = 0;
              horizontal_filter(src_03,(__m128i *)(ulong)alpha_01,iVar15,alpha_00,(int)lVar16,
                                in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0);
              iVar13 = iVar13 + iVar17;
            }
          }
        }
        else {
          iVar15 = uVar14 + iVar7;
          palVar11 = (__m128i *)0xfffffff9;
          lVar16 = lVar4;
          while (iVar3 = (int)palVar11, iVar3 < iVar10) {
            iVar2 = iVar13 + iVar3;
            iVar8 = iVar9;
            if (iVar2 < height) {
              iVar8 = iVar2;
            }
            if (iVar2 < 0) {
              iVar8 = 0;
            }
            local_208 = *(uint8_t **)
                         (ref + (long)(iVar8 * stride) + ((ulong)(uVar22 & 0x7fffffff) - 7));
            uStack_200 = *(undefined8 *)
                          (ref + (long)(iVar8 * stride) + ((ulong)(uVar22 & 0x7fffffff) - 7) + 8);
            iVar8 = stride;
            prepare_horizontal_filter_coeff_alpha0(iVar15,coeffs);
            src_00[1] = (longlong)coeffs;
            src_00[0] = (longlong)tmp;
            filter_src_pixels(src_00,(__m128i *)(ulong)alpha_00,palVar11,iVar8,(int)lVar16,
                              in_stack_fffffffffffffcd8);
            iVar15 = iVar15 + iVar17;
            palVar11 = (__m128i *)(ulong)(iVar3 + 1);
          }
        }
      }
      else {
        palVar11 = tmp;
        for (lVar16 = -7; lVar16 < iVar10; lVar16 = lVar16 + 1) {
          iVar15 = iVar13 + (int)lVar16;
          if ((long)height <= iVar13 + lVar16) {
            iVar15 = iVar9;
          }
          if (iVar13 + lVar16 < 0) {
            iVar15 = 0;
          }
          auVar24 = ZEXT416(((uint)ref[iVar15 * stride + width + -1] << (bVar6 & 0x1f)) + iVar20);
          auVar24 = pshuflw(auVar24,auVar24,0);
          uVar23 = auVar24._0_4_;
          *(undefined4 *)*palVar11 = uVar23;
          *(undefined4 *)((long)*palVar11 + 4) = uVar23;
          *(undefined4 *)(*palVar11 + 1) = uVar23;
          *(undefined4 *)((long)*palVar11 + 0xc) = uVar23;
          palVar11 = palVar11 + 1;
        }
      }
      iVar13 = (((uint)lVar5 & 0xfffc) + (iVar19 + gamma_00) * -4 & 0xffffffc0) + 0x10200;
      if (delta == 0 && gamma == 0) {
        unpack_weights_and_set_round_const
                  (conv_params,iVar12,offset_bits,&res_sub_const,&round_bits_const,&wt);
        iVar13 = iVar13 >> 10;
        coeffs[0][0]._0_4_ = *(undefined4 *)av1_warped_filter[iVar13];
        coeffs[1][0]._0_4_ = *(undefined4 *)(av1_warped_filter[iVar13] + 2);
        coeffs[2][0]._0_4_ = *(undefined4 *)(av1_warped_filter[iVar13] + 4);
        coeffs[3][0]._0_4_ = *(undefined4 *)(av1_warped_filter[iVar13] + 6);
        coeffs[0][0]._4_4_ = (undefined4)coeffs[0][0];
        coeffs[0][1]._0_4_ = (undefined4)coeffs[0][0];
        coeffs[0][1]._4_4_ = (undefined4)coeffs[0][0];
        coeffs[1][0]._4_4_ = (undefined4)coeffs[1][0];
        coeffs[1][1]._0_4_ = (undefined4)coeffs[1][0];
        coeffs[1][1]._4_4_ = (undefined4)coeffs[1][0];
        coeffs[2][0]._4_4_ = (undefined4)coeffs[2][0];
        coeffs[2][1]._0_4_ = (undefined4)coeffs[2][0];
        coeffs[2][1]._4_4_ = (undefined4)coeffs[2][0];
        coeffs[3][0]._4_4_ = (undefined4)coeffs[3][0];
        coeffs[3][1]._0_4_ = (undefined4)coeffs[3][0];
        coeffs[3][1]._4_4_ = (undefined4)coeffs[3][0];
        coeffs[4][0]._0_4_ = (undefined4)coeffs[0][0];
        coeffs[4][0]._4_4_ = (undefined4)coeffs[0][0];
        coeffs[4][1]._0_4_ = (undefined4)coeffs[0][0];
        coeffs[4][1]._4_4_ = (undefined4)coeffs[0][0];
        coeffs[5][0]._0_4_ = (undefined4)coeffs[1][0];
        coeffs[5][0]._4_4_ = (undefined4)coeffs[1][0];
        coeffs[5][1]._0_4_ = (undefined4)coeffs[1][0];
        coeffs[5][1]._4_4_ = (undefined4)coeffs[1][0];
        coeffs[6][0]._0_4_ = (undefined4)coeffs[2][0];
        coeffs[6][0]._4_4_ = (undefined4)coeffs[2][0];
        coeffs[6][1]._0_4_ = (undefined4)coeffs[2][0];
        coeffs[6][1]._4_4_ = (undefined4)coeffs[2][0];
        coeffs[7][0]._0_4_ = (undefined4)coeffs[3][0];
        coeffs[7][0]._4_4_ = (undefined4)coeffs[3][0];
        coeffs[7][1]._0_4_ = (undefined4)coeffs[3][0];
        coeffs[7][1]._4_4_ = (undefined4)coeffs[3][0];
        for (iVar13 = -4; iVar13 < iVar1; iVar13 = iVar13 + 1) {
          filter_src_pixels_vertical(tmp,coeffs,&res_lo,&local_1f8,iVar13);
          store_vertical_filter_output
                    (&res_lo,&local_1f8,(__m128i *)&local_218,&wt,&res_sub_const,&round_bits_const,
                     pred,conv_params,i,j,iVar13,reduce_bits_vert,p_stride,p_width,iVar12);
        }
      }
      else if (gamma == 0 && delta != 0) {
        unpack_weights_and_set_round_const
                  (conv_params,iVar12,offset_bits,&res_sub_const,&round_bits_const,&wt);
        for (iVar15 = -4; iVar15 < iVar1; iVar15 = iVar15 + 1) {
          iVar3 = iVar13 >> 10;
          coeffs[0][0]._0_4_ = *(undefined4 *)av1_warped_filter[iVar3];
          coeffs[1][0]._0_4_ = *(undefined4 *)(av1_warped_filter[iVar3] + 2);
          coeffs[2][0]._0_4_ = *(undefined4 *)(av1_warped_filter[iVar3] + 4);
          coeffs[3][0]._0_4_ = *(undefined4 *)(av1_warped_filter[iVar3] + 6);
          coeffs[0][0]._4_4_ = (undefined4)coeffs[0][0];
          coeffs[0][1]._0_4_ = (undefined4)coeffs[0][0];
          coeffs[0][1]._4_4_ = (undefined4)coeffs[0][0];
          coeffs[1][0]._4_4_ = (undefined4)coeffs[1][0];
          coeffs[1][1]._0_4_ = (undefined4)coeffs[1][0];
          coeffs[1][1]._4_4_ = (undefined4)coeffs[1][0];
          coeffs[2][0]._4_4_ = (undefined4)coeffs[2][0];
          coeffs[2][1]._0_4_ = (undefined4)coeffs[2][0];
          coeffs[2][1]._4_4_ = (undefined4)coeffs[2][0];
          coeffs[3][0]._4_4_ = (undefined4)coeffs[3][0];
          coeffs[3][1]._0_4_ = (undefined4)coeffs[3][0];
          coeffs[3][1]._4_4_ = (undefined4)coeffs[3][0];
          coeffs[4][0]._0_4_ = (undefined4)coeffs[0][0];
          coeffs[4][0]._4_4_ = (undefined4)coeffs[0][0];
          coeffs[4][1]._0_4_ = (undefined4)coeffs[0][0];
          coeffs[4][1]._4_4_ = (undefined4)coeffs[0][0];
          coeffs[5][0]._0_4_ = (undefined4)coeffs[1][0];
          coeffs[5][0]._4_4_ = (undefined4)coeffs[1][0];
          coeffs[5][1]._0_4_ = (undefined4)coeffs[1][0];
          coeffs[5][1]._4_4_ = (undefined4)coeffs[1][0];
          coeffs[6][0]._0_4_ = (undefined4)coeffs[2][0];
          coeffs[6][0]._4_4_ = (undefined4)coeffs[2][0];
          coeffs[6][1]._0_4_ = (undefined4)coeffs[2][0];
          coeffs[6][1]._4_4_ = (undefined4)coeffs[2][0];
          coeffs[7][0]._0_4_ = (undefined4)coeffs[3][0];
          coeffs[7][0]._4_4_ = (undefined4)coeffs[3][0];
          coeffs[7][1]._0_4_ = (undefined4)coeffs[3][0];
          coeffs[7][1]._4_4_ = (undefined4)coeffs[3][0];
          filter_src_pixels_vertical(tmp,coeffs,&res_lo,&local_1f8,iVar15);
          store_vertical_filter_output
                    (&res_lo,&local_1f8,(__m128i *)&local_218,&wt,&res_sub_const,&round_bits_const,
                     pred,conv_params,i,j,iVar15,reduce_bits_vert,p_stride,p_width,iVar12);
          iVar13 = iVar13 + iVar19;
        }
      }
      else if (gamma == 0 || delta != 0) {
        unpack_weights_and_set_round_const
                  (conv_params,iVar12,offset_bits,&res_sub_const,&round_bits_const,&wt);
        for (iVar15 = -4; iVar15 < iVar1; iVar15 = iVar15 + 1) {
          prepare_vertical_filter_coeffs(gamma_00,iVar13,coeffs);
          filter_src_pixels_vertical(tmp,coeffs,&res_lo,&local_1f8,iVar15);
          store_vertical_filter_output
                    (&res_lo,&local_1f8,(__m128i *)&local_218,&wt,&res_sub_const,&round_bits_const,
                     pred,conv_params,i,j,iVar15,reduce_bits_vert,p_stride,p_width,iVar12);
          iVar13 = iVar13 + iVar19;
        }
      }
      else {
        unpack_weights_and_set_round_const
                  (conv_params,iVar12,offset_bits,&res_sub_const,&round_bits_const,&wt);
        prepare_vertical_filter_coeffs(gamma_00,iVar13,coeffs);
        for (iVar13 = -4; iVar13 < iVar1; iVar13 = iVar13 + 1) {
          filter_src_pixels_vertical(tmp,coeffs,&res_lo,&local_1f8,iVar13);
          store_vertical_filter_output
                    (&res_lo,&local_1f8,(__m128i *)&local_218,&wt,&res_sub_const,&round_bits_const,
                     pred,conv_params,i,j,iVar13,reduce_bits_vert,p_stride,p_width,iVar12);
        }
      }
    }
  }
  return;
}

Assistant:

void av1_warp_affine_sse4_1(const int32_t *mat, const uint8_t *ref, int width,
                            int height, int stride, uint8_t *pred, int p_col,
                            int p_row, int p_width, int p_height, int p_stride,
                            int subsampling_x, int subsampling_y,
                            ConvolveParams *conv_params, int16_t alpha,
                            int16_t beta, int16_t gamma, int16_t delta) {
  __m128i tmp[15];
  int i, j, k;
  const int bd = 8;
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));

  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const __m128i reduce_bits_vert_const =
      _mm_set1_epi32(((1 << reduce_bits_vert) >> 1));
  const __m128i res_add_const = _mm_set1_epi32(1 << offset_bits_vert);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  assert(IMPLIES(conv_params->do_average, conv_params->is_compound));

  /* Note: For this code to work, the left/right frame borders need to be
  extended by at least 13 pixels each. By the time we get here, other
  code will have set up this border, but we allow an explicit check
  for debugging purposes.
  */
  /*for (i = 0; i < height; ++i) {
  for (j = 0; j < 13; ++j) {
  assert(ref[i * stride - 13 + j] == ref[i * stride]);
  assert(ref[i * stride + width + j] == ref[i * stride + (width - 1)]);
  }
  }*/
  __m128i res_add_const_1;
  if (conv_params->is_compound == 1) {
    res_add_const_1 = _mm_add_epi32(reduce_bits_vert_const, res_add_const);
  } else {
    res_add_const_1 = _mm_set1_epi32(-(1 << (bd + reduce_bits_vert - 1)) +
                                     ((1 << reduce_bits_vert) >> 1));
  }

  for (i = 0; i < p_height; i += 8) {
    for (j = 0; j < p_width; j += 8) {
      const int32_t src_x = (p_col + j + 4) << subsampling_x;
      const int32_t src_y = (p_row + i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      // Add in all the constant terms, including rounding and offset
      sx4 += alpha * (-4) + beta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
      sy4 += gamma * (-4) + delta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      // If the block is aligned such that, after clamping, every sample
      // would be taken from the leftmost/rightmost column, then we can
      // skip the expensive horizontal filter.
      if (ix4 <= -7) {
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] = _mm_set1_epi16(
              (1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
              ref[iy * stride] * (1 << (FILTER_BITS - reduce_bits_horiz)));
        }
      } else if (ix4 >= width + 6) {
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] =
              _mm_set1_epi16((1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
                             ref[iy * stride + (width - 1)] *
                                 (1 << (FILTER_BITS - reduce_bits_horiz)));
        }
      } else if (((ix4 - 7) < 0) || ((ix4 + 9) > width)) {
        const int out_of_boundary_left = -(ix4 - 6);
        const int out_of_boundary_right = (ix4 + 8) - width;
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          int sx = sx4 + beta * (k + 4);

          // Load source pixels
          __m128i src =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
          if (out_of_boundary_left >= 0) {
            const __m128i shuffle_reg_left =
                _mm_loadu_si128((__m128i *)warp_pad_left[out_of_boundary_left]);
            src = _mm_shuffle_epi8(src, shuffle_reg_left);
          }
          if (out_of_boundary_right >= 0) {
            const __m128i shuffle_reg_right = _mm_loadu_si128(
                (__m128i *)warp_pad_right[out_of_boundary_right]);
            src = _mm_shuffle_epi8(src, shuffle_reg_right);
          }
          horizontal_filter(src, tmp, sx, alpha, k, offset_bits_horiz,
                            reduce_bits_horiz);
        }
      } else {
        prepare_warp_horizontal_filter(ref, tmp, stride, ix4, iy4, sx4, alpha,
                                       beta, p_height, height, i,
                                       offset_bits_horiz, reduce_bits_horiz);
      }

      // Vertical filter
      prepare_warp_vertical_filter(
          pred, tmp, conv_params, gamma, delta, p_height, p_stride, p_width, i,
          j, sy4, reduce_bits_vert, &res_add_const_1, round_bits, offset_bits);
    }
  }
}